

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_startsWith_TestShell::~TEST_SimpleString_startsWith_TestShell
          (TEST_SimpleString_startsWith_TestShell *this)

{
  TEST_SimpleString_startsWith_TestShell *this_local;
  
  ~TEST_SimpleString_startsWith_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, startsWith)
{
    SimpleString hi("Hi you!");
    SimpleString part("Hi");
    SimpleString diff("Hrrm Hi you! ffdsfd");
    CHECK(hi.startsWith(part));
    CHECK(!part.startsWith(hi));
    CHECK(!diff.startsWith(hi));
}